

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::IncompleteCubeWrapModeCase::createTexture(IncompleteCubeWrapModeCase *this)

{
  ostringstream *this_00;
  GLsizei width;
  GLsizei height;
  bool bVar1;
  GLenum GVar2;
  long lVar3;
  GLuint texture;
  TextureFormat local_1f8;
  TextureLevel levelData;
  TextureFormat fmt;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [32];
  void *local_190;
  ios_base local_138 [264];
  
  local_1f8 = (TextureFormat)((this->super_TexCubeCompletenessCase).m_testCtx)->m_log;
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0x8513,0x2802,this->m_wrapS);
  glwTexParameteri(0x8513,0x2803,*(GLint *)&(this->super_TexCubeCompletenessCase).field_0x84);
  glwTexParameteri(0x8513,0x2801,0x2600);
  glwTexParameteri(0x8513,0x2800,0x2600);
  tcu::TextureLevel::setSize(&levelData,(this->m_size).m_data[0],(this->m_size).m_data[1],1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&levelData);
  local_1c0._0_4_ = 0.0;
  local_1c0._4_4_ = 0.0;
  local_1c0._8_8_ = &DAT_3f8000003f800000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)local_1c0);
  lVar3 = 0;
  do {
    GVar2 = *(GLenum *)((long)&s_cubeTargets + lVar3);
    width = (this->m_size).m_data[0];
    height = (this->m_size).m_data[1];
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&levelData);
    glwTexImage2D(GVar2,0,0x1908,width,height,0,0x1908,0x1401,local_190);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x18);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x339);
  bVar1 = isExtensionSupported(this->m_ctxInfo,"GL_OES_texture_npot");
  if (bVar1) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_4_ = local_1f8.order;
    local_1b0._4_4_ = local_1f8.type;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"GL_OES_texture_npot",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," supported, assuming completeness test to pass.",0x2f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    (this->super_TexCubeCompletenessCase).m_compareColor.m_value = 0xffff0000;
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void IncompleteCubeWrapModeCase::createTexture (void)
{
	TestLog&			log			= m_testCtx.getLog();
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures(1, &texture);
	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	levelData.setSize(m_size.x(), m_size.y());
	clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
		glTexImage2D(s_cubeTargets[targetNdx], 0, GL_RGBA, m_size.x(), m_size.y(), 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());

	GLU_CHECK_MSG("Set texturing state");

	const char* extension = "GL_OES_texture_npot";
	if (isExtensionSupported(m_ctxInfo, extension))
	{
		log << TestLog::Message << extension << " supported, assuming completeness test to pass." << TestLog::EndMessage;
		m_compareColor = RGBA(0,0,255,255);
	}
}